

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O0

bool deqp::gles3::Functional::ASTCDecompressionCaseInternal::compareBlockImages
               (Surface *reference,Surface *result,RGBA *thresholdRGBA,IVec2 *blockSize,
               int numNonDummyBlocks,IVec2 *firstFailedBlockCoordDst,Surface *errorMaskDst,
               IVec4 *maxDiffDst)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  InternalError *this;
  int *piVar5;
  Vector<bool,_4> local_10c;
  RGBA local_108;
  undefined8 local_104;
  undefined8 local_fc;
  Vector<bool,_4> local_f1;
  byte local_ed;
  undefined1 local_ec [7];
  bool isOk;
  undefined1 local_dc [8];
  IVec4 diff;
  IVec4 resPix;
  undefined1 local_a0 [8];
  IVec4 refPix;
  Vector<int,_2> local_88;
  IVec2 blockCoord;
  int x;
  int y;
  int local_70 [2];
  Vector<int,_2> local_68;
  int local_60;
  undefined1 local_5c [4];
  int numXBlocks;
  IVec4 threshold;
  int height;
  int width;
  IVec2 *firstFailedBlockCoordDst_local;
  int numNonDummyBlocks_local;
  IVec2 *blockSize_local;
  RGBA *thresholdRGBA_local;
  Surface *result_local;
  Surface *reference_local;
  
  while (dVar2 = ::deGetFalse(), dVar2 == 0) {
    iVar3 = tcu::Surface::getWidth(reference);
    iVar4 = tcu::Surface::getWidth(result);
    if (iVar3 != iVar4) break;
    iVar3 = tcu::Surface::getHeight(reference);
    iVar4 = tcu::Surface::getHeight(result);
    if (iVar3 != iVar4) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      threshold.m_data[3] = tcu::Surface::getWidth(result);
      threshold.m_data[2] = tcu::Surface::getHeight(result);
      tcu::RGBA::toIVec((RGBA *)local_5c);
      iVar3 = threshold.m_data[3];
      local_60 = tcu::Vector<int,_2>::x(blockSize);
      local_60 = iVar3 / local_60;
      tcu::Surface::setSize(errorMaskDst,threshold.m_data[3],threshold.m_data[2]);
      tcu::Vector<int,_2>::Vector(&local_68,-1,-1);
      *&firstFailedBlockCoordDst->m_data = local_68.m_data;
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,0);
      *(undefined8 *)maxDiffDst->m_data = _x;
      *(int (*) [2])(maxDiffDst->m_data + 2) = local_70;
      for (blockCoord.m_data[1] = 0; blockCoord.m_data[1] < threshold.m_data[2];
          blockCoord.m_data[1] = blockCoord.m_data[1] + 1) {
        for (blockCoord.m_data[0] = 0; blockCoord.m_data[0] < threshold.m_data[3];
            blockCoord.m_data[0] = blockCoord.m_data[0] + 1) {
          tcu::Vector<int,_2>::Vector
                    ((Vector<int,_2> *)(refPix.m_data + 2),blockCoord.m_data[0],blockCoord.m_data[1]
                    );
          tcu::operator/((tcu *)&local_88,(Vector<int,_2> *)(refPix.m_data + 2),blockSize);
          iVar3 = tcu::Vector<int,_2>::y(&local_88);
          iVar3 = iVar3 * local_60;
          iVar4 = tcu::Vector<int,_2>::x(&local_88);
          if (iVar3 + iVar4 < numNonDummyBlocks) {
            tcu::Surface::getPixel(reference,blockCoord.m_data[0],blockCoord.m_data[1]);
            tcu::RGBA::toIVec((RGBA *)local_a0);
            tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(resPix.m_data + 3),0xff,0,0xff,0xff);
            bVar1 = tcu::Vector<int,_4>::operator==
                              ((Vector<int,_4> *)local_a0,(Vector<int,_4> *)(resPix.m_data + 3));
            iVar4 = blockCoord.m_data[1];
            iVar3 = blockCoord.m_data[0];
            if (bVar1) {
              tcu::RGBA::RGBA((RGBA *)(resPix.m_data + 2),0xff,0,0xff,0xff);
              tcu::Surface::setPixel(errorMaskDst,iVar3,iVar4,(RGBA)resPix.m_data[2]);
            }
            else {
              diff.m_data[2] =
                   (int)tcu::Surface::getPixel(result,blockCoord.m_data[0],blockCoord.m_data[1]);
              tcu::RGBA::toIVec((RGBA *)(diff.m_data + 3));
              tcu::operator-((tcu *)local_ec,(Vector<int,_4> *)local_a0,
                             (Vector<int,_4> *)(diff.m_data + 3));
              tcu::abs<int,4>((tcu *)local_dc,(Vector<int,_4> *)local_ec);
              tcu::lessThanEqual<int,4>
                        ((tcu *)&local_f1,(Vector<int,_4> *)local_dc,(Vector<int,_4> *)local_5c);
              local_ed = tcu::boolAll<4>(&local_f1);
              tcu::max<int,4>((tcu *)&local_104,maxDiffDst,(Vector<int,_4> *)local_dc);
              iVar4 = blockCoord.m_data[1];
              iVar3 = blockCoord.m_data[0];
              *(undefined8 *)maxDiffDst->m_data = local_104;
              *(undefined8 *)(maxDiffDst->m_data + 2) = local_fc;
              if ((local_ed & 1) == 0) {
                local_108 = tcu::RGBA::red();
              }
              else {
                local_108 = tcu::RGBA::green();
              }
              tcu::Surface::setPixel(errorMaskDst,iVar3,iVar4,local_108);
              if (((local_ed & 1) == 0) &&
                 (piVar5 = tcu::Vector<int,_2>::x(firstFailedBlockCoordDst), *piVar5 == -1)) {
                *&firstFailedBlockCoordDst->m_data = local_88.m_data;
              }
            }
          }
        }
      }
      tcu::lessThanEqual<int,4>((tcu *)&local_10c,maxDiffDst,(Vector<int,_4> *)local_5c);
      bVar1 = tcu::boolAll<4>(&local_10c);
      return bVar1;
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,(char *)0x0,
             "reference.getWidth() == result.getWidth() && reference.getHeight() == result.getHeight()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fASTCDecompressionCases.cpp"
             ,0x91);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

static bool compareBlockImages (const Surface&		reference,
								const Surface&		result,
								const tcu::RGBA&	thresholdRGBA,
								const IVec2&		blockSize,
								int					numNonDummyBlocks,
								IVec2&				firstFailedBlockCoordDst,
								Surface&			errorMaskDst,
								IVec4&				maxDiffDst)
{
	TCU_CHECK_INTERNAL(reference.getWidth() == result.getWidth() && reference.getHeight() == result.getHeight());

	const int		width		= result.getWidth();
	const int		height		= result.getHeight();
	const IVec4		threshold	= thresholdRGBA.toIVec();
	const int		numXBlocks	= width / blockSize.x();

	DE_ASSERT(width % blockSize.x() == 0 && height % blockSize.y() == 0);

	errorMaskDst.setSize(width, height);

	firstFailedBlockCoordDst	= IVec2(-1, -1);
	maxDiffDst					= IVec4(0);

	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		const IVec2 blockCoord = IVec2(x, y) / blockSize;

		if (blockCoord.y()*numXBlocks + blockCoord.x() < numNonDummyBlocks)
		{
			const IVec4 refPix = reference.getPixel(x, y).toIVec();

			if (refPix == IVec4(255, 0, 255, 255))
			{
				// ASTC error color - allow anything in result.
				errorMaskDst.setPixel(x, y, tcu::RGBA(255, 0, 255, 255));
				continue;
			}

			const IVec4		resPix		= result.getPixel(x, y).toIVec();
			const IVec4		diff		= tcu::abs(refPix - resPix);
			const bool		isOk		= tcu::boolAll(tcu::lessThanEqual(diff, threshold));

			maxDiffDst = tcu::max(maxDiffDst, diff);

			errorMaskDst.setPixel(x, y, isOk ? tcu::RGBA::green() : tcu::RGBA::red());

			if (!isOk && firstFailedBlockCoordDst.x() == -1)
				firstFailedBlockCoordDst = blockCoord;
		}
	}

	return boolAll(lessThanEqual(maxDiffDst, threshold));
}